

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumper.c
# Opt level: O0

int yaml_emitter_open(yaml_emitter_t *emitter)

{
  int iVar1;
  undefined1 local_98 [8];
  yaml_mark_t mark;
  yaml_event_t event;
  yaml_emitter_t *emitter_local;
  
  memset(local_98,0,0x18);
  if (emitter == (yaml_emitter_t *)0x0) {
    __assert_fail("emitter",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/dumper.c"
                  ,0x43,"int yaml_emitter_open(yaml_emitter_t *)");
  }
  if (emitter->opened != 0) {
    __assert_fail("!emitter->opened",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/dumper.c"
                  ,0x44,"int yaml_emitter_open(yaml_emitter_t *)");
  }
  memset(&mark.column,0,0x68);
  mark.column._0_4_ = 1;
  iVar1 = yaml_emitter_emit(emitter,(yaml_event_t *)&mark.column);
  if (iVar1 != 0) {
    emitter->opened = 1;
  }
  emitter_local._4_4_ = (uint)(iVar1 != 0);
  return emitter_local._4_4_;
}

Assistant:

YAML_DECLARE(int)
yaml_emitter_open(yaml_emitter_t *emitter)
{
    yaml_event_t event;
    yaml_mark_t mark = { 0, 0, 0 };

    assert(emitter);            /* Non-NULL emitter object is required. */
    assert(!emitter->opened);   /* Emitter should not be opened yet. */

    STREAM_START_EVENT_INIT(event, YAML_ANY_ENCODING, mark, mark);

    if (!yaml_emitter_emit(emitter, &event)) {
        return 0;
    }

    emitter->opened = 1;

    return 1;
}